

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strip_accents.cpp
# Opt level: O1

string_t __thiscall
duckdb::StripAccentsOperator::Operation<duckdb::string_t,duckdb::string_t>
          (StripAccentsOperator *this,string_t input,Vector *result)

{
  utf8proc_uint8_t *puVar1;
  long lVar2;
  uint uVar3;
  utf8proc_uint8_t *puVar5;
  ulong uVar6;
  ulong len;
  anon_union_16_2_67f50693_for_value aVar7;
  undefined8 local_28;
  utf8proc_uint8_t *local_20;
  ulong uVar4;
  
  local_20 = input.value._0_8_;
  local_28 = this;
  len = (ulong)this & 0xffffffff;
  puVar5 = (utf8proc_uint8_t *)((long)&local_28 + 4);
  if (0xc < len) {
    puVar5 = local_20;
  }
  uVar3 = (uint)this & 0xfffffff8;
  uVar4 = (ulong)uVar3;
  uVar6 = 8;
  do {
    if (len < uVar6) {
      if (uVar3 == (uint)this) goto LAB_01129468;
      goto LAB_01129450;
    }
    lVar2 = uVar6 - 8;
    uVar6 = uVar6 + 8;
  } while ((*(ulong *)(puVar5 + lVar2) & 0x8080808080808080) == 0);
  goto LAB_01129426;
  while (uVar4 = uVar6, uVar6 < len) {
LAB_01129450:
    uVar6 = uVar4 + 1;
    puVar1 = puVar5 + uVar4;
    if ((char)*puVar1 < '\0') break;
  }
  if (-1 < (char)*puVar1) {
LAB_01129468:
    aVar7.pointer.ptr = (char *)local_20;
    aVar7._0_8_ = this;
    return (string_t)aVar7;
  }
LAB_01129426:
  puVar5 = utf8proc_remove_accents(puVar5,len);
  aVar7.pointer =
       (anon_struct_16_3_d7536bce_for_pointer)
       StringVector::AddString(input.value._8_8_,(char *)puVar5);
  free(puVar5);
  return (anon_union_16_2_67f50693_for_value)(anon_union_16_2_67f50693_for_value)aVar7.pointer;
}

Assistant:

static RESULT_TYPE Operation(INPUT_TYPE input, Vector &result) {
		if (IsAscii(input.GetData(), input.GetSize())) {
			return input;
		}

		// non-ascii, perform collation
		auto stripped = utf8proc_remove_accents((const utf8proc_uint8_t *)input.GetData(),
		                                        UnsafeNumericCast<utf8proc_ssize_t>(input.GetSize()));
		auto result_str = StringVector::AddString(result, const_char_ptr_cast(stripped));
		free(stripped);
		return result_str;
	}